

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O2

void __thiscall Diligent::VAOCache::VAOHashKey::VAOHashKey(VAOHashKey *this,VAOAttribs *Attribs)

{
  VertexStreamInfo<Diligent::BufferGLImpl> *pVVar1;
  uint uVar2;
  LayoutElement *pLVar3;
  VAOAttribs *pVVar4;
  Int32 IVar5;
  int iVar6;
  long lVar7;
  GraphicsPipelineDesc *pGVar8;
  size_t sVar9;
  Uint32 *Args_1;
  StreamAttribs *DstStream;
  StreamAttribs *FirstArg;
  Uint32 *pUVar10;
  BufferGLImpl *this_00;
  Uint32 *in_R8;
  ulong uVar11;
  undefined7 in_stack_ffffffffffffff68;
  Uint32 BufferSlot;
  int local_8c;
  size_t *local_88;
  Uint32 *local_80;
  VAOAttribs *local_78;
  string msg;
  char *local_40;
  char *local_38;
  
  IVar5 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
          ::GetUniqueID((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)Attribs->PSO);
  this->PsoUId = IVar5;
  local_78 = Attribs;
  if (Attribs->pIndexBuffer == (BufferGLImpl *)0x0) {
    IVar5 = 0;
  }
  else {
    IVar5 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                           *)Attribs->pIndexBuffer);
  }
  pVVar4 = local_78;
  this->IndexBufferUId = IVar5;
  this->UsedSlotsMask = 0;
  this->Hash = 0;
  Args_1 = &this->UsedSlotsMask;
  local_88 = &this->Hash;
  for (lVar7 = 0x10; lVar7 != 0x210; lVar7 = lVar7 + 0x10) {
    *(undefined4 *)((long)&((VAOHashKey *)(this->Streams + -1))->PsoUId + lVar7) = 0xffffffff;
  }
  local_80 = Args_1;
  pGVar8 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                     (&local_78->PSO->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  pLVar3 = (pGVar8->InputLayout).LayoutElements;
  sVar9 = ComputeHash<int,int>(&this->PsoUId,&this->IndexBufferUId);
  this->Hash = sVar9;
  pUVar10 = &pLVar3->BufferSlot;
  uVar11 = 0;
  do {
    if ((pGVar8->InputLayout).NumElements <= uVar11) {
      HashCombine<unsigned_int>(local_88,local_80);
      return;
    }
    BufferSlot = *pUVar10;
    if (0x1f < BufferSlot) {
      FormatString<char[26],char[30]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BufferSlot < MAX_BUFFER_SLOTS",(char (*) [30])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VAOHashKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                 ,0xbd);
      std::__cxx11::string::~string((string *)&msg);
    }
    uVar2 = pVVar4->NumVertexStreams;
    if (uVar2 <= BufferSlot) {
      local_8c = BufferSlot + 1;
      local_38 = "s";
      if (BufferSlot == 0) {
        local_38 = "";
      }
      local_40 = "are";
      if (uVar2 == 1) {
        local_40 = "is";
      }
      in_R8 = (Uint32 *)&local_38;
      FormatString<char[32],unsigned_int,char[8],char_const*,char[12],unsigned_int,char,char_const*,char[8]>
                (&msg,(Diligent *)"Input layout requires at least ",(char (*) [32])&local_8c,
                 (uint *)0x2d064b,(char (*) [8])in_R8,(char **)0x2e34b0,
                 (char (*) [12])&pVVar4->NumVertexStreams,(uint *)&stack0xffffffffffffff6f,
                 (char *)&local_40,(char **)0x2b9c29,
                 (char (*) [8])CONCAT17(0x20,in_stack_ffffffffffffff68));
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VAOHashKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                 ,0xc0);
      std::__cxx11::string::~string((string *)&msg);
    }
    pVVar1 = local_78->VertexStreams + BufferSlot;
    this_00 = local_78->VertexStreams[BufferSlot].pBuffer.m_pObject;
    if (this_00 == (BufferGLImpl *)0x0) {
      FormatString<char[29],unsigned_int,char[36]>
                (&msg,(Diligent *)"VAO requires buffer at slot ",(char (*) [29])&BufferSlot,
                 (uint *)", but none is bound in the context.",(char (*) [36])in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VAOHashKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                 ,0xc3);
      std::__cxx11::string::~string((string *)&msg);
      this_00 = (pVVar1->pBuffer).m_pObject;
      if (this_00 != (BufferGLImpl *)0x0) goto LAB_001b1829;
      iVar6 = 0;
    }
    else {
LAB_001b1829:
      iVar6 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                             *)this_00);
    }
    Args_1 = (Uint32 *)(ulong)BufferSlot;
    uVar2 = *local_80;
    FirstArg = this->Streams + (long)Args_1;
    in_R8 = local_80;
    if ((uVar2 >> (BufferSlot & 0x1f) & 1) == 0) {
      FirstArg->BufferUId = iVar6;
      FirstArg->Offset = pVVar1->Offset;
      *local_80 = uVar2 | 1 << ((byte)BufferSlot & 0x1f);
      HashCombine<int,unsigned_long>(local_88,&FirstArg->BufferUId,&FirstArg->Offset);
    }
    else {
      if (FirstArg->BufferUId != iVar6) {
        FormatString<char[26],char[30]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DstStream.BufferUId == BuffId",(char (*) [30])Args_1);
        Args_1 = (Uint32 *)0xd3;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xd3);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (FirstArg->Offset != pVVar1->Offset) {
        FormatString<char[26],char[37]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DstStream.Offset == SrcStream.Offset",(char (*) [37])Args_1);
        Args_1 = (Uint32 *)0xd4;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xd4);
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    uVar11 = uVar11 + 1;
    pUVar10 = pUVar10 + 10;
  } while( true );
}

Assistant:

VAOCache::VAOHashKey::VAOHashKey(const VAOAttribs& Attribs) :
    // clang-format off
    PsoUId         {Attribs.PSO.GetUniqueID()},
    IndexBufferUId {Attribs.pIndexBuffer ? Attribs.pIndexBuffer->GetUniqueID() : 0}
// clang-format on
{
#ifdef DILIGENT_DEBUG
    for (Uint32 i = 0; i < _countof(Streams); ++i)
        Streams[i].BufferUId = -1;
#endif

    const auto& InputLayout    = Attribs.PSO.GetGraphicsPipelineDesc().InputLayout;
    const auto* LayoutElements = InputLayout.LayoutElements;

    Hash = ComputeHash(PsoUId, IndexBufferUId);
    for (Uint32 i = 0; i < InputLayout.NumElements; ++i)
    {
        const auto& LayoutElem = LayoutElements[i];
        const auto  BufferSlot = LayoutElem.BufferSlot;
        VERIFY_EXPR(BufferSlot < MAX_BUFFER_SLOTS);
        DEV_CHECK_ERR(BufferSlot < Attribs.NumVertexStreams, "Input layout requires at least ", BufferSlot + 1,
                      " buffer", (BufferSlot > 0 ? "s" : ""), ", but only ", Attribs.NumVertexStreams, ' ',
                      (Attribs.NumVertexStreams == 1 ? "is" : "are"), " bound.");

        const auto& SrcStream = Attribs.VertexStreams[BufferSlot];
        DEV_CHECK_ERR(SrcStream.pBuffer, "VAO requires buffer at slot ", BufferSlot, ", but none is bound in the context.");

        const auto BuffId  = SrcStream.pBuffer ? SrcStream.pBuffer->GetUniqueID() : 0;
        const auto SlotBit = 1u << BufferSlot;
        if ((UsedSlotsMask & SlotBit) == 0)
        {
            auto& DstStream     = Streams[BufferSlot];
            DstStream.BufferUId = BuffId;
            DstStream.Offset    = SrcStream.Offset;
            UsedSlotsMask |= SlotBit;
            HashCombine(Hash, DstStream.BufferUId, DstStream.Offset);
        }
        else
        {
            const auto& DstStream = Streams[BufferSlot];
            // The slot has already been initialized
            VERIFY_EXPR(DstStream.BufferUId == BuffId);
            VERIFY_EXPR(DstStream.Offset == SrcStream.Offset);
        }
    }
    HashCombine(Hash, UsedSlotsMask);
}